

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O2

CharString * __thiscall icu_63::CharString::operator=(CharString *this,CharString *src)

{
  MaybeStackArray<char,_40>::operator=(&this->buffer,&src->buffer);
  this->len = src->len;
  src->len = 0;
  return this;
}

Assistant:

CharString& CharString::operator=(CharString&& src) U_NOEXCEPT {
    buffer = std::move(src.buffer);
    len = src.len;
    src.len = 0;  // not strictly necessary because we make no guarantees on the source string
    return *this;
}